

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildSystem.cpp
# Opt level: O3

void __thiscall
anon_unknown.dwarf_199c2b::BuildSystemFileDelegate::cannotLoadDueToMultipleProducers
          (BuildSystemFileDelegate *this,Node *output,
          vector<llbuild::buildsystem::Command_*,_std::allocator<llbuild::buildsystem::Command_*>_>
          *commands)

{
  BuildSystemDelegate *pBVar1;
  vector<llbuild::buildsystem::Command_*,_std::allocator<llbuild::buildsystem::Command_*>_> local_30
  ;
  
  pBVar1 = this->system->delegate;
  std::vector<llbuild::buildsystem::Command_*,_std::allocator<llbuild::buildsystem::Command_*>_>::
  vector(&local_30,commands);
  (*pBVar1->_vptr_BuildSystemDelegate[0x12])(pBVar1,output,&local_30);
  if (local_30.
      super__Vector_base<llbuild::buildsystem::Command_*,_std::allocator<llbuild::buildsystem::Command_*>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_30.
                    super__Vector_base<llbuild::buildsystem::Command_*,_std::allocator<llbuild::buildsystem::Command_*>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_30.
                          super__Vector_base<llbuild::buildsystem::Command_*,_std::allocator<llbuild::buildsystem::Command_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_30.
                          super__Vector_base<llbuild::buildsystem::Command_*,_std::allocator<llbuild::buildsystem::Command_*>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void
BuildSystemFileDelegate::cannotLoadDueToMultipleProducers(Node *output,
                                                          std::vector<Command*> commands) {
  getSystemDelegate().cannotBuildNodeDueToMultipleProducers(output, commands);
}